

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armutils.h
# Opt level: O2

bool asmjit::v1_14::arm::Utils::encodeLogicalImm(uint64_t imm,uint32_t width,LogicalImm *out)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  do {
    uVar7 = width >> 1;
    if (((imm >> ((byte)uVar7 & 0x3f) ^ imm) & ~(-1L << ((byte)uVar7 & 0x3f))) != 0) {
      uVar7 = width & 0xfffffffe;
      break;
    }
    bVar1 = 5 < width;
    width = uVar7;
  } while (bVar1);
  uVar4 = 0;
  if (uVar7 != 0) {
    uVar4 = 0xffffffffffffffff >> (-(char)uVar7 & 0x3fU);
  }
  uVar6 = imm & uVar4;
  if (uVar6 != uVar4 && uVar6 != 0) {
    lVar2 = 0;
    if ((uVar6 ^ 0xffffffffffffffff) != 0) {
      for (; ((uVar6 ^ 0xffffffffffffffff) >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    uVar6 = -1L << ((byte)lVar2 & 0x3f) ^ uVar6;
    lVar3 = 0;
    if ((uVar6 ^ 0xffffffffffffffff) != 0) {
      for (; ((uVar6 ^ 0xffffffffffffffff) >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
      }
    }
    uVar5 = (uint)lVar3;
    if (uVar6 == 0xffffffffffffffff) {
      uVar5 = uVar7;
    }
    uVar4 = 0xffffffffffffffff >> (-(char)uVar5 & 0x3fU);
    if (uVar5 == 0) {
      uVar4 = 0;
    }
    uVar9 = uVar4 ^ uVar6;
    lVar3 = 0;
    if (uVar9 != 0) {
      for (; (uVar9 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
      }
    }
    uVar8 = (uint)lVar3;
    if (uVar4 == uVar6) {
      uVar8 = uVar7;
    }
    uVar4 = 0xffffffffffffffff >> (-(char)uVar8 & 0x3fU);
    if (uVar8 == 0) {
      uVar4 = 0;
    }
    if ((uVar4 ^ uVar9) == 0xffffffffffffffff) {
      if ((lVar2 != 0) && (uVar7 != uVar8)) {
        return false;
      }
      out->n = (uint)(uVar7 == 0x40);
      out->s = uVar7 * -2 & 0x3e | ~uVar5 + (int)lVar2 + uVar8;
      out->r = uVar7 - uVar5;
      return true;
    }
  }
  return false;
}

Assistant:

ASMJIT_MAYBE_UNUSED
static bool encodeLogicalImm(uint64_t imm, uint32_t width, LogicalImm* out) noexcept {
  // Determine the element width, which must be 2, 4, 8, 16, 32, or 64 bits.
  do {
    width /= 2;
    uint64_t mask = (uint64_t(1) << width) - 1u;
    if ((imm & mask) != ((imm >> width) & mask)) {
      width *= 2;
      break;
    }
  } while (width > 2);

  // Patterns of all zeros and all ones are not encodable.
  uint64_t lsbMask = Support::lsbMask<uint64_t>(width);
  imm &= lsbMask;

  if (imm == 0 || imm == lsbMask)
    return false;

  // Inspect the pattern and get the most important bit indexes.
  //
  //         oIndex <-+      +-> zIndex
  //                  |      |
  // |..zeros..|oCount|zCount|..ones..|
  // |000000000|111111|000000|11111111|

  uint32_t zIndex = Support::ctz(~imm);
  uint64_t zImm = imm ^ ((uint64_t(1) << zIndex) - 1);
  uint32_t zCount = (zImm ? Support::ctz(zImm) : width) - zIndex;

  uint32_t oIndex = zIndex + zCount;
  uint64_t oImm = ~(zImm ^ Support::lsbMask<uint64_t>(oIndex));
  uint32_t oCount = (oImm ? Support::ctz(oImm) : width) - (oIndex);

  // Verify whether the bit-pattern is encodable.
  uint64_t mustBeZero = oImm ^ ~Support::lsbMask<uint64_t>(oIndex + oCount);
  if (mustBeZero != 0 || (zIndex > 0 && width - (oIndex + oCount) != 0))
    return false;

  out->n = width == 64;
  out->s = (oCount + zIndex - 1) | (Support::neg(width * 2) & 0x3F);
  out->r = width - oIndex;
  return true;
}